

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O0

uint64_t aom_sum_squares_2d_i16_c(int16_t *src,int src_stride,int width,int height)

{
  int16_t v;
  uint64_t ss;
  int c;
  int r;
  int height_local;
  int width_local;
  int src_stride_local;
  int16_t *src_local;
  
  ss = 0;
  src_local = src;
  for (r = 0; r < height; r = r + 1) {
    for (c = 0; c < width; c = c + 1) {
      ss = (long)((int)src_local[c] * (int)src_local[c]) + ss;
    }
    src_local = src_local + src_stride;
  }
  return ss;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_c(const int16_t *src, int src_stride, int width,
                                  int height) {
  int r, c;
  uint64_t ss = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const int16_t v = src[c];
      ss += v * v;
    }
    src += src_stride;
  }

  return ss;
}